

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# globals.cc
# Opt level: O0

void absl::lts_20250127::log_internal::RawSetStderrThreshold(LogSeverityAtLeast severity)

{
  LogSeverityAtLeast severity_local;
  memory_order __b;
  
  std::operator&(memory_order_release,__memory_order_mask);
  lts_20250127::(anonymous_namespace)::stderrthreshold = severity;
  return;
}

Assistant:

void RawSetStderrThreshold(absl::LogSeverityAtLeast severity) {
  stderrthreshold.store(static_cast<int>(severity), std::memory_order_release);
}